

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O0

void Color::print_row<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *column,vector<int,_std::allocator<int>_> *width)

{
  long lVar1;
  string *file;
  string *psVar2;
  ostream *poVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t i;
  allocator *paVar7;
  int line;
  undefined8 in_stack_ffffffffffffff80;
  LogSeverity severity;
  ulong uVar8;
  ulong __n;
  undefined1 local_71 [56];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  vector<int,_std::allocator<int>_> *local_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8;
  
  severity = (LogSeverity)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  file = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::size(in_RDI);
  psVar2 = (string *)std::vector<int,_std::allocator<int>_>::size(local_10);
  if (file != psVar2) {
    Logger::Logger(&local_14,ERR);
    paVar7 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/format_print.h"
               ,paVar7);
    line = (int)((ulong)paVar7 >> 0x20);
    psVar2 = (string *)local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_71 + 1),"print_row",(allocator *)psVar2);
    poVar3 = Logger::Start(severity,file,line,psVar2);
    poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/format_print.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd4);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"column.size()");
    poVar3 = std::operator<<(poVar3," = ");
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"width.size()");
    poVar3 = std::operator<<(poVar3," = ");
    sVar4 = std::vector<int,_std::allocator<int>_>::size(local_10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)(local_71 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  uVar8 = 0;
  while( true ) {
    __n = uVar8;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_8);
    if (sVar4 <= uVar8) break;
    lVar1 = *(long *)(std::cout + -0x18);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_10,__n);
    std::ios_base::width((ios_base *)((long)&std::cout + lVar1),(long)*pvVar5);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_8,__n);
    std::operator<<((ostream *)&std::cout,(string *)pvVar6);
    uVar8 = __n + 1;
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void print_row(const std::vector<T> &column, const std::vector<int> &width) {
  CHECK_EQ(column.size(), width.size());
  for (size_t i = 0; i < column.size(); ++i) {
    std::cout.width(width[i]);
    std::cout << column[i];
  }
  std::cout << "\n";
}